

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata.cc
# Opt level: O0

void __thiscall ProfileData::GetCurrentState(ProfileData *this,State *state)

{
  bool bVar1;
  char *local_38;
  int buf_size;
  State *state_local;
  ProfileData *this_local;
  
  bVar1 = enabled(this);
  if (bVar1) {
    state->enabled = true;
    state->start_time = this->start_time_;
    state->samples_gathered = this->count_;
    if (this->fname_ == (char *)0x0) {
      local_38 = "";
    }
    else {
      local_38 = this->fname_;
    }
    strncpy(state->profile_name,local_38,0x400);
    state->profile_name[0x3ff] = '\0';
  }
  else {
    state->enabled = false;
    state->start_time = 0;
    state->samples_gathered = 0;
    state->profile_name[0] = '\0';
  }
  return;
}

Assistant:

void ProfileData::GetCurrentState(State* state) const {
  if (enabled()) {
    state->enabled = true;
    state->start_time = start_time_;
    state->samples_gathered = count_;
    int buf_size = sizeof(state->profile_name);
    strncpy(state->profile_name, fname_ ? fname_ : "", buf_size);
    state->profile_name[buf_size-1] = '\0';
  } else {
    state->enabled = false;
    state->start_time = 0;
    state->samples_gathered = 0;
    state->profile_name[0] = '\0';
  }
}